

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void shunt_map_left(tgestate_t *state)

{
  long in_RDI;
  tgestate_t *in_stack_00000010;
  
  *(char *)(in_RDI + 0x691) = *(char *)(in_RDI + 0x691) + '\x01';
  get_supertiles(in_stack_00000010);
  memmove(*(void **)(in_RDI + 0x790),(void *)(*(long *)(in_RDI + 0x790) + 1),0x197);
  memmove(*(void **)(in_RDI + 0x7a0),(void *)(*(long *)(in_RDI + 0x7a0) + 1),0xcbf);
  plot_rightmost_tiles(in_stack_00000010);
  return;
}

Assistant:

void shunt_map_left(tgestate_t *state)
{
  assert(state != NULL);

  state->map_position.x++;

  get_supertiles(state);

  memmove(&state->tile_buf[0], &state->tile_buf[1], TILE_BUF_LENGTH - 1);
  memmove(&state->window_buf[0], &state->window_buf[1], WINDOW_BUF_LENGTH - 1);

  plot_rightmost_tiles(state);
}